

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

bool gguf_write_to_file(gguf_context *ctx,char *fname,bool only_meta)

{
  FILE *__s;
  char *__ptr;
  size_type __n;
  vector<signed_char,_std::allocator<signed_char>_> *pvVar1;
  vector<signed_char,_std::allocator<signed_char>_> *pvVar2;
  undefined8 in_RSI;
  bool ok;
  vector<signed_char,_std::allocator<signed_char>_> buf;
  FILE *file;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffffc7;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_ffffffffffffffc8;
  gguf_context *in_stack_ffffffffffffffd0;
  bool local_1;
  
  __s = (FILE *)ggml_fopen(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (__s == (FILE *)0x0) {
    fprintf(_stderr,"%s: failed to open file \'%s\' for writing GGUF data\n","gguf_write_to_file",
            in_RSI);
    local_1 = false;
  }
  else {
    std::vector<signed_char,_std::allocator<signed_char>_>::vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)0x192191);
    gguf_write_to_buf(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                      (bool)in_stack_ffffffffffffffc7);
    pvVar1 = (vector<signed_char,_std::allocator<signed_char>_> *)&stack0xffffffffffffffc0;
    __ptr = std::vector<signed_char,_std::allocator<signed_char>_>::data
                      ((vector<signed_char,_std::allocator<signed_char>_> *)0x1921b9);
    __n = std::vector<signed_char,_std::allocator<signed_char>_>::size(pvVar1);
    pvVar1 = (vector<signed_char,_std::allocator<signed_char>_> *)fwrite(__ptr,1,__n,__s);
    pvVar2 = (vector<signed_char,_std::allocator<signed_char>_> *)
             std::vector<signed_char,_std::allocator<signed_char>_>::size
                       ((vector<signed_char,_std::allocator<signed_char>_> *)
                        &stack0xffffffffffffffc0);
    local_1 = pvVar1 == pvVar2;
    fclose(__s);
    std::vector<signed_char,_std::allocator<signed_char>_>::~vector(pvVar1);
  }
  return local_1;
}

Assistant:

bool gguf_write_to_file(const struct gguf_context * ctx, const char * fname, bool only_meta) {
    FILE * file = ggml_fopen(fname, "wb");

    if (!file) {
        fprintf(stderr, "%s: failed to open file '%s' for writing GGUF data\n", __func__, fname);
        return false;
    }

    std::vector<int8_t> buf;
    gguf_write_to_buf(ctx, buf, only_meta);
    const bool ok = fwrite(buf.data(), 1, buf.size(), file) == buf.size();
    fclose(file);
    return ok;
}